

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

ai_real Assimp::PLYImporter::NormalizeColorValue(ValueUnion val,EDataType eType)

{
  int iStack_18;
  EDataType eType_local;
  ValueUnion val_local;
  
  iStack_18 = val.iInt;
  switch(eType) {
  case EDT_Char:
    val_local._4_4_ = (float)(iStack_18 + 0x7f) / 255.0;
    break;
  case EDT_UChar:
    val_local._4_4_ = (float)((ulong)val & 0xffffffff) / 255.0;
    break;
  case EDT_Short:
    val_local._4_4_ = (float)(iStack_18 + 0x7fff) / 65535.0;
    break;
  case EDT_UShort:
    val_local._4_4_ = (float)((ulong)val & 0xffffffff) / 65535.0;
    break;
  case EDT_Int:
    val_local._4_4_ = (float)iStack_18 / 255.0 + 0.5;
    break;
  case EDT_UInt:
    val_local._4_4_ = (float)((ulong)val & 0xffffffff) / 65535.0;
    break;
  case EDT_Float:
    val_local._4_4_ = iStack_18;
    break;
  case EDT_Double:
    val_local._4_4_ = (undefined4)val.fDouble;
    break;
  default:
    val_local._4_4_ = 0;
  }
  return (ai_real)val_local._4_4_;
}

Assistant:

ai_real PLYImporter::NormalizeColorValue(PLY::PropertyInstance::ValueUnion val, PLY::EDataType eType) {
    switch (eType) {
        case EDT_Float:
            return val.fFloat;
        case EDT_Double:
            return (ai_real)val.fDouble;
        case EDT_UChar:
            return (ai_real)val.iUInt / (ai_real)0xFF;
        case EDT_Char:
            return (ai_real)(val.iInt + (0xFF / 2)) / (ai_real)0xFF;
        case EDT_UShort:
            return (ai_real)val.iUInt / (ai_real)0xFFFF;
        case EDT_Short:
            return (ai_real)(val.iInt + (0xFFFF / 2)) / (ai_real)0xFFFF;
        case EDT_UInt:
            return (ai_real)val.iUInt / (ai_real)0xFFFF;
        case EDT_Int:
            return ((ai_real)val.iInt / (ai_real)0xFF) + 0.5f;
        default:
            break;
    }

    return 0.0f;
}